

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.cpp
# Opt level: O1

void __thiscall phaeton::ASTVisitor::visitProgram(ASTVisitor *this,Program *Prog)

{
  ElementDirective *pEVar1;
  
  (*(Prog->Decls->
    super_ASTNodeList<const_phaeton::Decl,_(phaeton::ASTNode::ASTNodeKind)1,_phaeton::DeclList>).
    super_ASTNode._vptr_ASTNode[2])(Prog->Decls,this);
  pEVar1 = Prog->Elem;
  if (pEVar1 != (ElementDirective *)0x0) {
    (*(pEVar1->super_ASTNode)._vptr_ASTNode[2])(pEVar1,this);
  }
  (*(Prog->Stmts->
    super_ASTNodeList<const_phaeton::Stmt,_(phaeton::ASTNode::ASTNodeKind)2,_phaeton::StmtList>).
    super_ASTNode._vptr_ASTNode[2])(Prog->Stmts,this);
  return;
}

Assistant:

void ASTVisitor::visitProgram(const Program *Prog) {
  Prog->getDecls()->visit(this);

  // Note: the element directive may not be present in a program,
  // so 'ed == nullptr' is possible. we need to process this corner case.
  const ElementDirective *ED = Prog->getElem();
  if (ED) {
    ED->visit(this);
  }

  Prog->getStmts()->visit(this);
}